

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O0

int ON_SHA1_Hash::Compare(ON_SHA1_Hash *a,ON_SHA1_Hash *b)

{
  int local_24;
  int i;
  ON_SHA1_Hash *b_local;
  ON_SHA1_Hash *a_local;
  
  local_24 = 0;
  while( true ) {
    if (0x13 < local_24) {
      return 0;
    }
    if (a->m_digest[local_24] < b->m_digest[local_24]) break;
    if (b->m_digest[local_24] < a->m_digest[local_24]) {
      return 1;
    }
    local_24 = local_24 + 1;
  }
  return -1;
}

Assistant:

int ON_SHA1_Hash::Compare(
  const ON_SHA1_Hash& a,
  const ON_SHA1_Hash& b
  )
{
  for (int i = 0; i < 20; i++)
  {
    if (a.m_digest[i] < b.m_digest[i])
      return -1;
    if (a.m_digest[i] > b.m_digest[i])
      return 1;
  }
  return 0;
}